

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ForkHubBase::ForkHubBase
          (ForkHubBase *this,Own<kj::_::PromiseNode> *innerParam,ExceptionOrValue *resultRef)

{
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EventLoop *pEVar5;
  
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0062e8d8;
  (this->super_Refcounted).refcount = 0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_006287b0;
  pEVar5 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar5;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006288c8;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00628900;
  uVar2 = *(undefined4 *)((long)&innerParam->disposer + 4);
  uVar3 = *(undefined4 *)&innerParam->ptr;
  uVar4 = *(undefined4 *)((long)&innerParam->ptr + 4);
  *(undefined4 *)&(this->inner).disposer = *(undefined4 *)&innerParam->disposer;
  *(undefined4 *)((long)&(this->inner).disposer + 4) = uVar2;
  *(undefined4 *)&(this->inner).ptr = uVar3;
  *(undefined4 *)((long)&(this->inner).ptr + 4) = uVar4;
  innerParam->ptr = (PromiseNode *)0x0;
  this->resultRef = resultRef;
  this->headBranch = (ForkBranchBase *)0x0;
  this->tailBranch = &this->headBranch;
  pPVar1 = (this->inner).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ForkHubBase::ForkHubBase(Own<PromiseNode>&& innerParam, ExceptionOrValue& resultRef)
    : inner(kj::mv(innerParam)), resultRef(resultRef) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}